

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O0

int test_ints(void)

{
  int iVar1;
  uint32_t uVar2;
  ptrdiff_t pVar3;
  int64_t iVar4;
  char *pcVar5;
  char *d;
  ptrdiff_t sz;
  char *local_2a8;
  char *d4_16;
  char *d3_16;
  char *d2_16;
  char *d1_16;
  char *local_280;
  char *d4_15;
  char *d3_15;
  char *d2_15;
  char *d1_15;
  char *local_258;
  char *d4_14;
  char *d3_14;
  char *d2_14;
  char *d1_14;
  char *local_230;
  char *d4_13;
  char *d3_13;
  char *d2_13;
  char *d1_13;
  char *local_208;
  char *d4_12;
  char *d3_12;
  char *d2_12;
  char *d1_12;
  char *local_1e0;
  char *d4_11;
  char *d3_11;
  char *d2_11;
  char *d1_11;
  char *local_1b8;
  char *d4_10;
  char *d3_10;
  char *d2_10;
  char *d1_10;
  char *local_190;
  char *d4_9;
  char *d3_9;
  char *d2_9;
  char *d1_9;
  char *local_168;
  char *d4_8;
  char *d3_8;
  char *d2_8;
  char *d1_8;
  char *local_140;
  char *d4_7;
  char *d3_7;
  char *d2_7;
  char *d1_7;
  char *local_118;
  char *d4_6;
  char *d3_6;
  char *d2_6;
  char *d1_6;
  char *local_f0;
  char *d4_5;
  char *d3_5;
  char *d2_5;
  char *d1_5;
  char *local_c8;
  char *d4_4;
  char *d3_4;
  char *d2_4;
  char *d1_4;
  char *local_a0;
  char *d4_3;
  char *d3_3;
  char *d2_3;
  char *d1_3;
  char *local_78;
  char *d4_2;
  char *d3_2;
  char *d2_2;
  char *d1_2;
  char *local_50;
  char *d4_1;
  char *d3_1;
  char *d2_1;
  char *d1_1;
  char *local_28;
  char *d4;
  char *d3;
  char *d2;
  char *d1;
  
  _plan(0xa2,true);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","test_ints");
  d2 = mp_encode_int(data,-1);
  d3 = data;
  d4 = data;
  local_28 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"int -0x01");
  d1_1._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_int(data,d2);
  _ok((uint)(pVar3 == 0),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x104,
      "mp_check_int(-0x01) == 0");
  iVar4 = mp_decode_int(&d3);
  _ok((uint)(iVar4 == -1),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x01)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x104,
      "mp_decode(mp_encode(-0x01)) == -0x01");
  mp_next(&d4);
  iVar1 = mp_check(&local_28,d4 + 1);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x104,
      "mp_check(-0x01)");
  _ok((uint)((long)d2 - (long)data == 1),"(d1 - data) == (1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x104,
      "len(mp_encode_int(-0x01)");
  _ok((uint)(d2 == d3),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x104,
      "len(mp_decode_int(-0x01))");
  _ok((uint)(d2 == d4),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x104,
      "len(mp_next_int(-0x01))");
  _ok((uint)(d2 == local_28),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x104,
      "len(mp_check_int(-0x01))");
  uVar2 = mp_sizeof_int(-1);
  _ok((uint)(uVar2 == 1),"mp_sizeof_int(-0x01) == 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x104,
      "mp_sizeof_int(-0x01)");
  iVar1 = memcmp(data,anon_var_dwarf_5cf + 2,1);
  _ok((uint)(iVar1 == 0),"memcmp(data, (\"\\xff\"), (1)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x104,
      "mp_encode(-0x01) == \"\\xff\"");
  d2_1 = mp_encode_int(data,-0x1e);
  d3_1 = data;
  d4_1 = data;
  local_50 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"int -0x1e");
  d1_2._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_int(data,d2_1);
  _ok((uint)(pVar3 == 0),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x105,
      "mp_check_int(-0x1e) == 0");
  iVar4 = mp_decode_int(&d3_1);
  _ok((uint)(iVar4 == -0x1e),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x1e)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x105,
      "mp_decode(mp_encode(-0x1e)) == -0x1e");
  mp_next(&d4_1);
  iVar1 = mp_check(&local_50,d4_1 + 1);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x105,
      "mp_check(-0x1e)");
  _ok((uint)((long)d2_1 - (long)data == 1),"(d1 - data) == (1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x105,
      "len(mp_encode_int(-0x1e)");
  _ok((uint)(d2_1 == d3_1),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x105,
      "len(mp_decode_int(-0x1e))");
  _ok((uint)(d2_1 == d4_1),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x105,
      "len(mp_next_int(-0x1e))");
  _ok((uint)(d2_1 == local_50),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x105,
      "len(mp_check_int(-0x1e))");
  uVar2 = mp_sizeof_int(-0x1e);
  _ok((uint)(uVar2 == 1),"mp_sizeof_int(-0x1e) == 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x105,
      "mp_sizeof_int(-0x1e)");
  iVar1 = memcmp(data,anon_var_dwarf_1ec7,1);
  _ok((uint)(iVar1 == 0),"memcmp(data, (\"\\xe2\"), (1)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x105,
      "mp_encode(-0x1e) == \"\\xe2\"");
  d2_2 = mp_encode_int(data,-0x1f);
  d3_2 = data;
  d4_2 = data;
  local_78 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"int -0x1f");
  d1_3._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_int(data,d2_2);
  _ok((uint)(pVar3 == 0),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x106,
      "mp_check_int(-0x1f) == 0");
  iVar4 = mp_decode_int(&d3_2);
  _ok((uint)(iVar4 == -0x1f),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x1f)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x106,
      "mp_decode(mp_encode(-0x1f)) == -0x1f");
  mp_next(&d4_2);
  iVar1 = mp_check(&local_78,d4_2 + 1);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x106,
      "mp_check(-0x1f)");
  _ok((uint)((long)d2_2 - (long)data == 1),"(d1 - data) == (1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x106,
      "len(mp_encode_int(-0x1f)");
  _ok((uint)(d2_2 == d3_2),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x106,
      "len(mp_decode_int(-0x1f))");
  _ok((uint)(d2_2 == d4_2),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x106,
      "len(mp_next_int(-0x1f))");
  _ok((uint)(d2_2 == local_78),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x106,
      "len(mp_check_int(-0x1f))");
  uVar2 = mp_sizeof_int(-0x1f);
  _ok((uint)(uVar2 == 1),"mp_sizeof_int(-0x1f) == 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x106,
      "mp_sizeof_int(-0x1f)");
  iVar1 = memcmp(data,anon_var_dwarf_1f6f,1);
  _ok((uint)(iVar1 == 0),"memcmp(data, (\"\\xe1\"), (1)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x106,
      "mp_encode(-0x1f) == \"\\xe1\"");
  d2_3 = mp_encode_int(data,-0x20);
  d3_3 = data;
  d4_3 = data;
  local_a0 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"int -0x20");
  d1_4._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_int(data,d2_3);
  _ok((uint)(pVar3 == 0),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x107,
      "mp_check_int(-0x20) == 0");
  iVar4 = mp_decode_int(&d3_3);
  _ok((uint)(iVar4 == -0x20),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x20)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x107,
      "mp_decode(mp_encode(-0x20)) == -0x20");
  mp_next(&d4_3);
  iVar1 = mp_check(&local_a0,d4_3 + 1);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x107,
      "mp_check(-0x20)");
  _ok((uint)((long)d2_3 - (long)data == 1),"(d1 - data) == (1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x107,
      "len(mp_encode_int(-0x20)");
  _ok((uint)(d2_3 == d3_3),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x107,
      "len(mp_decode_int(-0x20))");
  _ok((uint)(d2_3 == d4_3),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x107,
      "len(mp_next_int(-0x20))");
  _ok((uint)(d2_3 == local_a0),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x107,
      "len(mp_check_int(-0x20))");
  uVar2 = mp_sizeof_int(-0x20);
  _ok((uint)(uVar2 == 1),"mp_sizeof_int(-0x20) == 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x107,
      "mp_sizeof_int(-0x20)");
  iVar1 = memcmp(data,anon_var_dwarf_2017,1);
  _ok((uint)(iVar1 == 0),"memcmp(data, (\"\\xe0\"), (1)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x107,
      "mp_encode(-0x20) == \"\\xe0\"");
  d2_4 = mp_encode_int(data,-0x21);
  d3_4 = data;
  d4_4 = data;
  local_c8 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"int -0x21");
  d1_5._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_int(data,d2_4);
  _ok((uint)(pVar3 == 0),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x108,
      "mp_check_int(-0x21) == 0");
  iVar4 = mp_decode_int(&d3_4);
  _ok((uint)(iVar4 == -0x21),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x21)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x108,
      "mp_decode(mp_encode(-0x21)) == -0x21");
  mp_next(&d4_4);
  iVar1 = mp_check(&local_c8,d4_4 + 2);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x108,
      "mp_check(-0x21)");
  _ok((uint)((long)d2_4 - (long)data == 2),"(d1 - data) == (2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x108,
      "len(mp_encode_int(-0x21)");
  _ok((uint)(d2_4 == d3_4),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x108,
      "len(mp_decode_int(-0x21))");
  _ok((uint)(d2_4 == d4_4),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x108,
      "len(mp_next_int(-0x21))");
  _ok((uint)(d2_4 == local_c8),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x108,
      "len(mp_check_int(-0x21))");
  uVar2 = mp_sizeof_int(-0x21);
  _ok((uint)(uVar2 == 2),"mp_sizeof_int(-0x21) == 2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x108,
      "mp_sizeof_int(-0x21)");
  _ok((uint)(*(short *)data == -0x2030),"memcmp(data, (\"\\xd0\\xdf\"), (2)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x108,
      "mp_encode(-0x21) == \"\\xd0\\xdf\"");
  d2_5 = mp_encode_int(data,-0x7f);
  d3_5 = data;
  d4_5 = data;
  local_f0 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"int -0x7f");
  d1_6._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_int(data,d2_5);
  _ok((uint)(pVar3 == 0),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10a,
      "mp_check_int(-0x7f) == 0");
  iVar4 = mp_decode_int(&d3_5);
  _ok((uint)(iVar4 == -0x7f),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x7f)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10a,
      "mp_decode(mp_encode(-0x7f)) == -0x7f");
  mp_next(&d4_5);
  iVar1 = mp_check(&local_f0,d4_5 + 2);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10a,
      "mp_check(-0x7f)");
  _ok((uint)((long)d2_5 - (long)data == 2),"(d1 - data) == (2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10a,
      "len(mp_encode_int(-0x7f)");
  _ok((uint)(d2_5 == d3_5),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10a,
      "len(mp_decode_int(-0x7f))");
  _ok((uint)(d2_5 == d4_5),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10a,
      "len(mp_next_int(-0x7f))");
  _ok((uint)(d2_5 == local_f0),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10a,
      "len(mp_check_int(-0x7f))");
  uVar2 = mp_sizeof_int(-0x7f);
  _ok((uint)(uVar2 == 2),"mp_sizeof_int(-0x7f) == 2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10a,
      "mp_sizeof_int(-0x7f)");
  _ok((uint)(*(short *)data == -0x7e30),"memcmp(data, (\"\\xd0\\x81\"), (2)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10a,
      "mp_encode(-0x7f) == \"\\xd0\\x81\"");
  d2_6 = mp_encode_int(data,-0x80);
  d3_6 = data;
  d4_6 = data;
  local_118 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"int -0x80");
  d1_7._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_int(data,d2_6);
  _ok((uint)(pVar3 == 0),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10b,
      "mp_check_int(-0x80) == 0");
  iVar4 = mp_decode_int(&d3_6);
  _ok((uint)(iVar4 == -0x80),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x80)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10b,
      "mp_decode(mp_encode(-0x80)) == -0x80");
  mp_next(&d4_6);
  iVar1 = mp_check(&local_118,d4_6 + 2);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10b,
      "mp_check(-0x80)");
  _ok((uint)((long)d2_6 - (long)data == 2),"(d1 - data) == (2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10b,
      "len(mp_encode_int(-0x80)");
  _ok((uint)(d2_6 == d3_6),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10b,
      "len(mp_decode_int(-0x80))");
  _ok((uint)(d2_6 == d4_6),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10b,
      "len(mp_next_int(-0x80))");
  _ok((uint)(d2_6 == local_118),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10b,
      "len(mp_check_int(-0x80))");
  uVar2 = mp_sizeof_int(-0x80);
  _ok((uint)(uVar2 == 2),"mp_sizeof_int(-0x80) == 2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10b,
      "mp_sizeof_int(-0x80)");
  _ok((uint)(*(short *)data == -0x7f30),"memcmp(data, (\"\\xd0\\x80\"), (2)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10b,
      "mp_encode(-0x80) == \"\\xd0\\x80\"");
  d2_7 = mp_encode_int(data,-0x81);
  d3_7 = data;
  d4_7 = data;
  local_140 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"int -0x81");
  d1_8._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_int(data,d2_7);
  _ok((uint)(pVar3 == 0),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10d,
      "mp_check_int(-0x81) == 0");
  iVar4 = mp_decode_int(&d3_7);
  _ok((uint)(iVar4 == -0x81),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x81)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10d,
      "mp_decode(mp_encode(-0x81)) == -0x81");
  mp_next(&d4_7);
  iVar1 = mp_check(&local_140,d4_7 + 3);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10d,
      "mp_check(-0x81)");
  _ok((uint)((long)d2_7 - (long)data == 3),"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10d,
      "len(mp_encode_int(-0x81)");
  _ok((uint)(d2_7 == d3_7),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10d,
      "len(mp_decode_int(-0x81))");
  _ok((uint)(d2_7 == d4_7),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10d,
      "len(mp_next_int(-0x81))");
  _ok((uint)(d2_7 == local_140),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10d,
      "len(mp_check_int(-0x81))");
  uVar2 = mp_sizeof_int(-0x81);
  _ok((uint)(uVar2 == 3),"mp_sizeof_int(-0x81) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10d,
      "mp_sizeof_int(-0x81)");
  iVar1 = memcmp(data,anon_var_dwarf_22b7,3);
  _ok((uint)(iVar1 == 0),"memcmp(data, (\"\\xd1\\xff\\x7f\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10d,
      "mp_encode(-0x81) == \"\\xd1\\xff\\x7f\"");
  d2_8 = mp_encode_int(data,-0x7fff);
  d3_8 = data;
  d4_8 = data;
  local_168 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"int -0x7fff");
  d1_9._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_int(data,d2_8);
  _ok((uint)(pVar3 == 0),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10e,
      "mp_check_int(-0x7fff) == 0");
  iVar4 = mp_decode_int(&d3_8);
  _ok((uint)(iVar4 == -0x7fff),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x7fff)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10e,
      "mp_decode(mp_encode(-0x7fff)) == -0x7fff");
  mp_next(&d4_8);
  iVar1 = mp_check(&local_168,d4_8 + 3);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10e,
      "mp_check(-0x7fff)");
  _ok((uint)((long)d2_8 - (long)data == 3),"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10e,
      "len(mp_encode_int(-0x7fff)");
  _ok((uint)(d2_8 == d3_8),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10e,
      "len(mp_decode_int(-0x7fff))");
  _ok((uint)(d2_8 == d4_8),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10e,
      "len(mp_next_int(-0x7fff))");
  _ok((uint)(d2_8 == local_168),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10e,
      "len(mp_check_int(-0x7fff))");
  uVar2 = mp_sizeof_int(-0x7fff);
  _ok((uint)(uVar2 == 3),"mp_sizeof_int(-0x7fff) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10e,
      "mp_sizeof_int(-0x7fff)");
  iVar1 = memcmp(data,anon_var_dwarf_236b,3);
  _ok((uint)(iVar1 == 0),"memcmp(data, (\"\\xd1\\x80\\x01\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10e,
      "mp_encode(-0x7fff) == \"\\xd1\\x80\\x01\"");
  d2_9 = mp_encode_int(data,-0x8000);
  d3_9 = data;
  d4_9 = data;
  local_190 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"int -0x8000");
  d1_10._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_int(data,d2_9);
  _ok((uint)(pVar3 == 0),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10f,
      "mp_check_int(-0x8000) == 0");
  iVar4 = mp_decode_int(&d3_9);
  _ok((uint)(iVar4 == -0x8000),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x8000)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10f,
      "mp_decode(mp_encode(-0x8000)) == -0x8000");
  mp_next(&d4_9);
  iVar1 = mp_check(&local_190,d4_9 + 3);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10f,
      "mp_check(-0x8000)");
  _ok((uint)((long)d2_9 - (long)data == 3),"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10f,
      "len(mp_encode_int(-0x8000)");
  _ok((uint)(d2_9 == d3_9),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10f,
      "len(mp_decode_int(-0x8000))");
  _ok((uint)(d2_9 == d4_9),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10f,
      "len(mp_next_int(-0x8000))");
  _ok((uint)(d2_9 == local_190),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10f,
      "len(mp_check_int(-0x8000))");
  uVar2 = mp_sizeof_int(-0x8000);
  _ok((uint)(uVar2 == 3),"mp_sizeof_int(-0x8000) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10f,
      "mp_sizeof_int(-0x8000)");
  iVar1 = memcmp(data,anon_var_dwarf_2413,3);
  _ok((uint)(iVar1 == 0),"memcmp(data, (\"\\xd1\\x80\\x00\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10f,
      "mp_encode(-0x8000) == \"\\xd1\\x80\\x00\"");
  d2_10 = mp_encode_int(data,-0x8001);
  d3_10 = data;
  d4_10 = data;
  local_1b8 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"int -0x8001");
  d1_11._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_int(data,d2_10);
  _ok((uint)(pVar3 == 0),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x111,
      "mp_check_int(-0x8001) == 0");
  iVar4 = mp_decode_int(&d3_10);
  _ok((uint)(iVar4 == -0x8001),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x8001)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x111,
      "mp_decode(mp_encode(-0x8001)) == -0x8001");
  mp_next(&d4_10);
  iVar1 = mp_check(&local_1b8,d4_10 + 5);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x111,
      "mp_check(-0x8001)");
  _ok((uint)((long)d2_10 - (long)data == 5),"(d1 - data) == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x111,
      "len(mp_encode_int(-0x8001)");
  _ok((uint)(d2_10 == d3_10),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x111,
      "len(mp_decode_int(-0x8001))");
  _ok((uint)(d2_10 == d4_10),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x111,
      "len(mp_next_int(-0x8001))");
  _ok((uint)(d2_10 == local_1b8),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x111,
      "len(mp_check_int(-0x8001))");
  uVar2 = mp_sizeof_int(-0x8001);
  _ok((uint)(uVar2 == 5),"mp_sizeof_int(-0x8001) == 5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x111,
      "mp_sizeof_int(-0x8001)");
  iVar1 = memcmp(data,anon_var_dwarf_24bb,5);
  _ok((uint)(iVar1 == 0),"memcmp(data, (\"\\xd2\\xff\\xff\\x7f\\xff\"), (5)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x111,
      "mp_encode(-0x8001) == \"\\xd2\\xff\\xff\\x7f\\xff\"");
  d2_11 = mp_encode_int(data,-0x7fffffff);
  d3_11 = data;
  d4_11 = data;
  local_1e0 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"int -0x7fffffff");
  d1_12._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_int(data,d2_11);
  _ok((uint)(pVar3 == 0),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x112,
      "mp_check_int(-0x7fffffff) == 0");
  iVar4 = mp_decode_int(&d3_11);
  _ok((uint)(iVar4 == -0x7fffffff),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x7fffffff)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x112,
      "mp_decode(mp_encode(-0x7fffffff)) == -0x7fffffff");
  mp_next(&d4_11);
  iVar1 = mp_check(&local_1e0,d4_11 + 5);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x112,
      "mp_check(-0x7fffffff)");
  _ok((uint)((long)d2_11 - (long)data == 5),"(d1 - data) == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x112,
      "len(mp_encode_int(-0x7fffffff)");
  _ok((uint)(d2_11 == d3_11),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x112,
      "len(mp_decode_int(-0x7fffffff))");
  _ok((uint)(d2_11 == d4_11),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x112,
      "len(mp_next_int(-0x7fffffff))");
  _ok((uint)(d2_11 == local_1e0),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x112,
      "len(mp_check_int(-0x7fffffff))");
  uVar2 = mp_sizeof_int(-0x7fffffff);
  _ok((uint)(uVar2 == 5),"mp_sizeof_int(-0x7fffffff) == 5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x112,
      "mp_sizeof_int(-0x7fffffff)");
  iVar1 = memcmp(data,anon_var_dwarf_256f,5);
  _ok((uint)(iVar1 == 0),"memcmp(data, (\"\\xd2\\x80\\x00\\x00\\x01\"), (5)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x112,
      "mp_encode(-0x7fffffff) == \"\\xd2\\x80\\x00\\x00\\x01\"");
  d2_12 = mp_encode_int(data,-0x80000000);
  d3_12 = data;
  d4_12 = data;
  local_208 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"int -0x80000000LL");
  d1_13._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_int(data,d2_12);
  _ok((uint)(pVar3 == 0),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x113,
      "mp_check_int(-0x80000000LL) == 0");
  iVar4 = mp_decode_int(&d3_12);
  _ok((uint)(iVar4 == -0x80000000),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x80000000LL)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x113,
      "mp_decode(mp_encode(-0x80000000LL)) == -0x80000000LL");
  mp_next(&d4_12);
  iVar1 = mp_check(&local_208,d4_12 + 5);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x113,
      "mp_check(-0x80000000LL)");
  _ok((uint)((long)d2_12 - (long)data == 5),"(d1 - data) == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x113,
      "len(mp_encode_int(-0x80000000LL)");
  _ok((uint)(d2_12 == d3_12),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x113,
      "len(mp_decode_int(-0x80000000LL))");
  _ok((uint)(d2_12 == d4_12),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x113,
      "len(mp_next_int(-0x80000000LL))");
  _ok((uint)(d2_12 == local_208),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x113,
      "len(mp_check_int(-0x80000000LL))");
  uVar2 = mp_sizeof_int(-0x80000000);
  _ok((uint)(uVar2 == 5),"mp_sizeof_int(-0x80000000LL) == 5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x113,
      "mp_sizeof_int(-0x80000000LL)");
  iVar1 = memcmp(data,anon_var_dwarf_2623,5);
  _ok((uint)(iVar1 == 0),"memcmp(data, (\"\\xd2\\x80\\x00\\x00\\x00\"), (5)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x113,
      "mp_encode(-0x80000000LL) == \"\\xd2\\x80\\x00\\x00\\x00\"");
  d2_13 = mp_encode_int(data,-0x80000001);
  d3_13 = data;
  d4_13 = data;
  local_230 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"int -0x80000001LL");
  d1_14._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_int(data,d2_13);
  _ok((uint)(pVar3 == 0),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x116,
      "mp_check_int(-0x80000001LL) == 0");
  iVar4 = mp_decode_int(&d3_13);
  _ok((uint)(iVar4 == -0x80000001),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x80000001LL)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x116,
      "mp_decode(mp_encode(-0x80000001LL)) == -0x80000001LL");
  mp_next(&d4_13);
  iVar1 = mp_check(&local_230,d4_13 + 9);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 9)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x116,
      "mp_check(-0x80000001LL)");
  _ok((uint)((long)d2_13 - (long)data == 9),"(d1 - data) == (9)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x116,
      "len(mp_encode_int(-0x80000001LL)");
  _ok((uint)(d2_13 == d3_13),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x116,
      "len(mp_decode_int(-0x80000001LL))");
  _ok((uint)(d2_13 == d4_13),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x116,
      "len(mp_next_int(-0x80000001LL))");
  _ok((uint)(d2_13 == local_230),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x116,
      "len(mp_check_int(-0x80000001LL))");
  uVar2 = mp_sizeof_int(-0x80000001);
  _ok((uint)(uVar2 == 9),"mp_sizeof_int(-0x80000001LL) == 9",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x116,
      "mp_sizeof_int(-0x80000001LL)");
  iVar1 = memcmp(data,anon_var_dwarf_26d7,9);
  _ok((uint)(iVar1 == 0),
      "memcmp(data, (\"\\xd3\\xff\\xff\\xff\\xff\\x7f\\xff\\xff\\xff\"), (9)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x116,
      "mp_encode(-0x80000001LL) == \"\\xd3\\xff\\xff\\xff\\xff\\x7f\\xff\\xff\\xff\"");
  d2_14 = mp_encode_int(data,-0x80000001);
  d3_14 = data;
  d4_14 = data;
  local_258 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"int -0x80000001LL");
  d1_15._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_int(data,d2_14);
  _ok((uint)(pVar3 == 0),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x118,
      "mp_check_int(-0x80000001LL) == 0");
  iVar4 = mp_decode_int(&d3_14);
  _ok((uint)(iVar4 == -0x80000001),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x80000001LL)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x118,
      "mp_decode(mp_encode(-0x80000001LL)) == -0x80000001LL");
  mp_next(&d4_14);
  iVar1 = mp_check(&local_258,d4_14 + 9);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 9)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x118,
      "mp_check(-0x80000001LL)");
  _ok((uint)((long)d2_14 - (long)data == 9),"(d1 - data) == (9)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x118,
      "len(mp_encode_int(-0x80000001LL)");
  _ok((uint)(d2_14 == d3_14),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x118,
      "len(mp_decode_int(-0x80000001LL))");
  _ok((uint)(d2_14 == d4_14),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x118,
      "len(mp_next_int(-0x80000001LL))");
  _ok((uint)(d2_14 == local_258),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x118,
      "len(mp_check_int(-0x80000001LL))");
  uVar2 = mp_sizeof_int(-0x80000001);
  _ok((uint)(uVar2 == 9),"mp_sizeof_int(-0x80000001LL) == 9",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x118,
      "mp_sizeof_int(-0x80000001LL)");
  iVar1 = memcmp(data,anon_var_dwarf_26d7,9);
  _ok((uint)(iVar1 == 0),
      "memcmp(data, (\"\\xd3\\xff\\xff\\xff\\xff\\x7f\\xff\\xff\\xff\"), (9)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x118,
      "mp_encode(-0x80000001LL) == \"\\xd3\\xff\\xff\\xff\\xff\\x7f\\xff\\xff\\xff\"");
  d2_15 = mp_encode_int(data,-0x7fffffffffffffff);
  d3_15 = data;
  d4_15 = data;
  local_280 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"int -0x7fffffffffffffffLL");
  d1_16._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_int(data,d2_15);
  _ok((uint)(pVar3 == 0),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11a,
      "mp_check_int(-0x7fffffffffffffffLL) == 0");
  iVar4 = mp_decode_int(&d3_15);
  _ok((uint)(iVar4 == -0x7fffffffffffffff),
      "mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x7fffffffffffffffLL)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11a,
      "mp_decode(mp_encode(-0x7fffffffffffffffLL)) == -0x7fffffffffffffffLL");
  mp_next(&d4_15);
  iVar1 = mp_check(&local_280,d4_15 + 9);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 9)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11a,
      "mp_check(-0x7fffffffffffffffLL)");
  _ok((uint)((long)d2_15 - (long)data == 9),"(d1 - data) == (9)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11a,
      "len(mp_encode_int(-0x7fffffffffffffffLL)");
  _ok((uint)(d2_15 == d3_15),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11a,
      "len(mp_decode_int(-0x7fffffffffffffffLL))");
  _ok((uint)(d2_15 == d4_15),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11a,
      "len(mp_next_int(-0x7fffffffffffffffLL))");
  _ok((uint)(d2_15 == local_280),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11a,
      "len(mp_check_int(-0x7fffffffffffffffLL))");
  uVar2 = mp_sizeof_int(-0x7fffffffffffffff);
  _ok((uint)(uVar2 == 9),"mp_sizeof_int(-0x7fffffffffffffffLL) == 9",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11a,
      "mp_sizeof_int(-0x7fffffffffffffffLL)");
  iVar1 = memcmp(data,anon_var_dwarf_2797,9);
  _ok((uint)(iVar1 == 0),
      "memcmp(data, (\"\\xd3\\x80\\x00\\x00\\x00\\x00\\x00\\x00\\x01\"), (9)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11a,
      "mp_encode(-0x7fffffffffffffffLL) == \"\\xd3\\x80\\x00\\x00\\x00\\x00\\x00\\x00\\x01\"");
  d2_16 = mp_encode_int(data,-0x8000000000000000);
  d3_16 = data;
  d4_16 = data;
  local_2a8 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"int (int64_t)-0x8000000000000000LL");
  sz._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_int(data,d2_16);
  _ok((uint)(pVar3 == 0),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11c,
      "mp_check_int((int64_t)-0x8000000000000000LL) == 0");
  iVar4 = mp_decode_int(&d3_16);
  _ok((uint)(iVar4 == -0x8000000000000000),
      "mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == ((int64_t)-0x8000000000000000LL)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11c,
      "mp_decode(mp_encode((int64_t)-0x8000000000000000LL)) == (int64_t)-0x8000000000000000LL");
  mp_next(&d4_16);
  iVar1 = mp_check(&local_2a8,d4_16 + 9);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 9)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11c,
      "mp_check((int64_t)-0x8000000000000000LL)");
  _ok((uint)((long)d2_16 - (long)data == 9),"(d1 - data) == (9)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11c,
      "len(mp_encode_int((int64_t)-0x8000000000000000LL)");
  _ok((uint)(d2_16 == d3_16),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11c,
      "len(mp_decode_int((int64_t)-0x8000000000000000LL))");
  _ok((uint)(d2_16 == d4_16),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11c,
      "len(mp_next_int((int64_t)-0x8000000000000000LL))");
  _ok((uint)(d2_16 == local_2a8),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11c,
      "len(mp_check_int((int64_t)-0x8000000000000000LL))");
  uVar2 = mp_sizeof_int(-0x8000000000000000);
  _ok((uint)(uVar2 == 9),"mp_sizeof_int((int64_t)-0x8000000000000000LL) == 9",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11c,
      "mp_sizeof_int((int64_t)-0x8000000000000000LL)");
  iVar1 = memcmp(data,anon_var_dwarf_2857,9);
  _ok((uint)(iVar1 == 0),
      "memcmp(data, (\"\\xd3\\x80\\x00\\x00\\x00\\x00\\x00\\x00\\x00\"), (9)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11c,
      "mp_encode((int64_t)-0x8000000000000000LL) == \"\\xd3\\x80\\x00\\x00\\x00\\x00\\x00\\x00\\x00\""
     );
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"int_safe");
  sz._0_4_ = fprintf(_stdout,"\n");
  d = (char *)0x0;
  pcVar5 = mp_encode_int_safe((char *)0x0,(ptrdiff_t *)&d,-0x80000000);
  _ok((uint)(d == (char *)0xfffffffffffffffb),"-sz == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11e,
      "size after mp_encode_int_safe(NULL, &sz)");
  _ok((uint)(pcVar5 == (char *)0x0),"d == NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11e,
      "mp_encode_int_safe(NULL, &sz)");
  d = (char *)0x5;
  pcVar5 = mp_encode_int_safe(data,(ptrdiff_t *)&d,-0x80000000);
  _ok((uint)(d == (char *)0x0),"sz == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11e,
      "size after mp_encode_int_safe(buf, &sz)");
  _ok((uint)((long)pcVar5 - (long)data == 5),"(d - data) == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11e,
      "len of mp_encode_int_safe(buf, &sz)");
  iVar1 = memcmp(data,anon_var_dwarf_2623,5);
  _ok((uint)(iVar1 == 0),"memcmp(data, (\"\\xd2\\x80\\x00\\x00\\x00\"), (5)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11e,
      "mp_encode_int_safe(buf, &sz)");
  d = (char *)0x4;
  pcVar5 = mp_encode_int_safe(data,(ptrdiff_t *)&d,-0x80000000);
  _ok((uint)(d == (char *)0xffffffffffffffff),"sz == -1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11e,
      "size after mp_encode_int_safe(buf, &sz) overflow");
  _ok((uint)(pcVar5 == data),"d == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11e,
      "mp_encode_int_safe(buf, &sz) overflow");
  pcVar5 = mp_encode_int_safe(data,(ptrdiff_t *)0x0,-0x80000000);
  _ok((uint)((long)pcVar5 - (long)data == 5),"(d - data) == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11e,
      "len of mp_encode_int_safe(buf, NULL)");
  iVar1 = memcmp(data,anon_var_dwarf_2623,5);
  _ok((uint)(iVar1 == 0),"memcmp(data, (\"\\xd2\\x80\\x00\\x00\\x00\"), (5)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11e,
      "mp_encode_int_safe(buf, NULL)");
  _space((FILE *)_stdout);
  printf("# *** %s: done ***\n","test_ints");
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

static int
test_ints(void)
{
	plan(17*9 + 9);
	header();

	test_int(-0x01, "\xff", 1);
	test_int(-0x1e, "\xe2", 1);
	test_int(-0x1f, "\xe1", 1);
	test_int(-0x20, "\xe0", 1);
	test_int(-0x21, "\xd0\xdf", 2);

	test_int(-0x7f, "\xd0\x81", 2);
	test_int(-0x80, "\xd0\x80", 2);

	test_int(-0x81, "\xd1\xff\x7f", 3);
	test_int(-0x7fff, "\xd1\x80\x01", 3);
	test_int(-0x8000, "\xd1\x80\x00", 3);

	test_int(-0x8001, "\xd2\xff\xff\x7f\xff", 5);
	test_int(-0x7fffffff, "\xd2\x80\x00\x00\x01", 5);
	test_int(-0x80000000LL, "\xd2\x80\x00\x00\x00", 5);

	test_int(-0x80000001LL,
	     "\xd3\xff\xff\xff\xff\x7f\xff\xff\xff", 9);
	test_int(-0x80000001LL,
	     "\xd3\xff\xff\xff\xff\x7f\xff\xff\xff", 9);
	test_int(-0x7fffffffffffffffLL,
	     "\xd3\x80\x00\x00\x00\x00\x00\x00\x01", 9);
	test_int((int64_t)-0x8000000000000000LL,
	     "\xd3\x80\x00\x00\x00\x00\x00\x00\x00", 9);

	test_int_safe(-0x80000000LL, "\xd2\x80\x00\x00\x00", 5);

	footer();
	return check_plan();
}